

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O1

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_append_entries(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  element_type *peVar3;
  ulong uVar4;
  element_type *peVar5;
  element_type *peVar6;
  long lVar7;
  element_type *peVar8;
  _func_int **pp_Var9;
  long *plVar10;
  int iVar11;
  undefined8 uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  undefined4 extraout_var;
  size_t sVar17;
  undefined4 extraout_var_00;
  runtime_error *prVar18;
  long in_RDX;
  undefined **ppuVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long lVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  ptr<resp_msg> pVar25;
  ptr<log_entry> old_entry;
  ptr<log_entry> entry;
  long *local_160 [2];
  long local_150 [2];
  long local_140;
  long local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  raft_server *local_128;
  raft_server *local_120;
  long local_118;
  long local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  char local_100 [104];
  char *local_98;
  char *local_38;
  
  local_120 = (raft_server *)req;
  if (*(element_type **)(in_RDX + 8) ==
      ((req[3].log_entries_.
        super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
    iVar11 = *(int *)&req[3].log_entries_.
                      super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    if (iVar11 == 2) {
      become_follower((raft_server *)req);
    }
    else {
      if (iVar11 == 3) {
        plVar10 = (long *)req[4].last_log_term_;
        local_38 = 
        "Receive AppendEntriesRequest from another leader(%d) with same term, there must be a bug, server exits"
        ;
        snprintf(local_100,200,
                 "Receive AppendEntriesRequest from another leader(%d) with same term, there must be a bug, server exits"
                 ,(ulong)*(uint *)(in_RDX + 0x14));
        local_160[0] = local_150;
        sVar17 = strlen(local_100);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_160,local_100,local_100 + sVar17);
        (**(code **)(*plVar10 + 0x10))(plVar10,local_160);
        std::__cxx11::string::~string((string *)local_160);
        peVar3 = (((((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                      *)&local_120->ctx_)->
                   super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (**(code **)(peVar3->term_ + 0x40))(peVar3,0xffffffff);
        exit(-1);
      }
      restart_election_timer((raft_server *)req);
    }
  }
  peVar3 = ((req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
           super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  uVar12 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
  this->_vptr_raft_server = (_func_int **)0x0;
  puVar13 = (undefined8 *)operator_new(0x40);
  puVar13[1] = 0x100000001;
  *puVar13 = &PTR___Sp_counted_ptr_inplace_0017a728;
  uVar2 = *(undefined4 *)((long)&(req->super_msg_base).term_ + 4);
  puVar13[3] = peVar3;
  *(undefined4 *)(puVar13 + 4) = 4;
  *(undefined4 *)((long)puVar13 + 0x24) = uVar2;
  *(undefined4 *)(puVar13 + 5) = uVar1;
  ppuVar19 = &PTR__msg_base_0017a778;
  puVar13[2] = &PTR__msg_base_0017a778;
  puVar13[6] = uVar12;
  *(undefined1 *)(puVar13 + 7) = 0;
  *(undefined8 **)&this->leader_ = puVar13;
  this->_vptr_raft_server = (_func_int **)(puVar13 + 2);
  uVar21 = *(ulong *)(in_RDX + 0x28);
  if (uVar21 == 0) {
    bVar23 = false;
  }
  else {
    auVar24 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
    ppuVar19 = auVar24._8_8_;
    bVar23 = true;
    if (uVar21 < auVar24._0_8_) {
      uVar4 = *(ulong *)(in_RDX + 0x20);
      uVar14 = term_for_log((raft_server *)req,*(ulong *)(in_RDX + 0x28));
      bVar23 = uVar4 != uVar14;
      ppuVar19 = (undefined **)extraout_RDX;
    }
  }
  if ((bVar23) ||
     (*(element_type **)(in_RDX + 8) <
      ((req[3].log_entries_.
        super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr))
  goto LAB_0014dd00;
  local_140 = in_RDX;
  local_128 = this;
  if (*(long *)(in_RDX + 0x40) != *(long *)(in_RDX + 0x38)) {
    lVar22 = *(long *)(in_RDX + 0x28) + 1;
    lVar20 = 8;
    for (uVar21 = 0;
        (uVar15 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))(), lVar7 = lVar22,
        uVar21 + lVar22 < uVar15 &&
        (uVar21 < (ulong)(*(long *)(in_RDX + 0x40) - *(long *)(in_RDX + 0x38) >> 4)));
        uVar21 = uVar21 + 1) {
      lVar16 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x48))();
      if ((ulong)(*(long *)(in_RDX + 0x40) - *(long *)(in_RDX + 0x38) >> 4) <= uVar21)
      goto LAB_0014dd26;
      if (lVar16 != **(long **)(*(long *)(in_RDX + 0x38) + -8 + lVar20)) break;
      lVar20 = lVar20 + 0x10;
    }
    do {
      local_118 = lVar7;
      iVar11 = (*((((raft_server *)req)->log_store_).
                  super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_log_store[2])();
      uVar15 = uVar21 + lVar22;
      if ((CONCAT44(extraout_var,iVar11) <= uVar15) ||
         ((ulong)(*(long *)(in_RDX + 0x40) - *(long *)(in_RDX + 0x38) >> 4) <= uVar21))
      goto LAB_0014db6a;
      peVar5 = (((raft_server *)req)->log_store_).
               super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar5->_vptr_log_store[8])(&local_138,peVar5,uVar15);
      if (*(int *)(local_138 + 8) == 2) {
        peVar8 = (((raft_server *)req)->l_).
                 super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_98 = "revert from a prev config change to config at %llu";
        snprintf(local_100,100,"revert from a prev config change to config at %llu",
                 ((((raft_server *)req)->config_).
                  super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->log_idx_);
        local_160[0] = local_150;
        sVar17 = strlen(local_100);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_160,local_100,local_100 + sVar17);
        (*peVar8->_vptr_logger[3])(peVar8,(string *)local_160);
        lVar22 = local_118;
        req = (req_msg *)local_120;
        in_RDX = local_140;
        if (local_160[0] != local_150) {
          operator_delete(local_160[0],local_150[0] + 1);
        }
        ((raft_server *)req)->config_changing_ = false;
      }
      else if (*(int *)(local_138 + 8) == 1) {
        if (*(long *)(local_138 + 0x18) == 0) {
          prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar18,"get_buf cannot be called for a log_entry with nil buffer");
          __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        peVar6 = (((raft_server *)req)->state_machine_).
                 super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar6->_vptr_state_machine[4])
                  (peVar6,uVar15,*(long *)(local_138 + 0x18),local_138 + 0x20);
      }
      lVar7 = *(long *)(in_RDX + 0x38);
      if ((ulong)(*(long *)(in_RDX + 0x40) - lVar7 >> 4) <= uVar21) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar21);
LAB_0014dd26:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar21);
        goto LAB_0014dd37;
      }
      local_110 = *(long *)(lVar7 + -8 + lVar20);
      local_108 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar7 + lVar20);
      if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_108->_M_use_count = local_108->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_108->_M_use_count = local_108->_M_use_count + 1;
        }
      }
      peVar5 = (((raft_server *)req)->log_store_).
               super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar5->_vptr_log_store[6])(peVar5,uVar15,&local_110);
      if (*(int *)(local_110 + 8) == 2) {
        peVar8 = (((raft_server *)req)->l_).
                 super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_98 = "receive a config change from leader at %llu";
        snprintf(local_100,100,"receive a config change from leader at %llu",uVar15);
        local_160[0] = local_150;
        sVar17 = strlen(local_100);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_160,local_100,local_100 + sVar17);
        (*peVar8->_vptr_logger[3])(peVar8,(string *)local_160);
        lVar22 = local_118;
        req = (req_msg *)local_120;
        in_RDX = local_140;
        if (local_160[0] != local_150) {
          operator_delete(local_160[0],local_150[0] + 1);
        }
        ((raft_server *)req)->config_changing_ = true;
      }
      else if (*(int *)(local_110 + 8) == 1) {
        if (*(long *)(local_110 + 0x18) == 0) {
          prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar18,"get_buf cannot be called for a log_entry with nil buffer");
          __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        peVar6 = (((raft_server *)req)->state_machine_).
                 super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar6->_vptr_state_machine[3])
                  (peVar6,uVar15,*(long *)(local_110 + 0x18),local_110 + 0x20);
      }
      if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
      }
      if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
      }
      lVar20 = lVar20 + 0x10;
      uVar21 = uVar21 + 1;
      lVar7 = local_118;
    } while( true );
  }
  goto LAB_0014dcc1;
LAB_0014db6a:
  lVar22 = *(long *)(in_RDX + 0x38);
  if (uVar21 < (ulong)(*(long *)(in_RDX + 0x40) - lVar22 >> 4)) {
    do {
      local_138 = *(long *)(lVar22 + -8 + lVar20);
      local_130 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar22 + lVar20);
      if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_130->_M_use_count = local_130->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_130->_M_use_count = local_130->_M_use_count + 1;
        }
      }
      peVar5 = (((raft_server *)req)->log_store_).
               super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar11 = (*peVar5->_vptr_log_store[5])(peVar5,&local_138);
      if (*(int *)(local_138 + 8) == 1) {
        if (*(long *)(local_138 + 0x18) == 0) {
LAB_0014dd37:
          prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar18,"get_buf cannot be called for a log_entry with nil buffer");
          __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        peVar6 = (((raft_server *)req)->state_machine_).
                 super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar6->_vptr_state_machine[3])
                  (peVar6,CONCAT44(extraout_var_00,iVar11),*(long *)(local_138 + 0x18),
                   local_138 + 0x20);
      }
      else if (*(int *)(local_138 + 8) == 2) {
        peVar8 = (((raft_server *)req)->l_).
                 super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_98 = "receive a config change from leader at %llu";
        snprintf(local_100,100,"receive a config change from leader at %llu",
                 CONCAT44(extraout_var_00,iVar11));
        local_160[0] = local_150;
        sVar17 = strlen(local_100);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_160,local_100,local_100 + sVar17);
        (*peVar8->_vptr_logger[3])(peVar8,(string *)local_160);
        if (local_160[0] != local_150) {
          operator_delete(local_160[0],local_150[0] + 1);
        }
        ((raft_server *)req)->config_changing_ = true;
      }
      if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
      }
      uVar21 = uVar21 + 1;
      lVar22 = *(long *)(local_140 + 0x38);
      lVar20 = lVar20 + 0x10;
    } while (uVar21 < (ulong)(*(long *)(local_140 + 0x40) - lVar22 >> 4));
  }
LAB_0014dcc1:
  this = local_128;
  ((raft_server *)req)->leader_ = *(int32 *)(local_140 + 0x14);
  commit((raft_server *)req,*(ulong *)(local_140 + 0x30));
  pp_Var9 = this->_vptr_raft_server;
  ppuVar19 = (undefined **)(*(long *)(local_140 + 0x40) - *(long *)(local_140 + 0x38) >> 4);
  pp_Var9[4] = (_func_int *)
               ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar19)->
                       _vptr__Sp_counted_base + *(long *)(local_140 + 0x28) + 1);
  *(undefined1 *)(pp_Var9 + 5) = 1;
LAB_0014dd00:
  pVar25.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar19;
  pVar25.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar25.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_append_entries(req_msg& req)
{
    if (req.get_term() == state_->get_term())
    {
        if (role_ == srv_role::candidate)
        {
            become_follower();
        }
        else if (role_ == srv_role::leader)
        {
            l_->debug(lstrfmt("Receive AppendEntriesRequest from another leader(%d) with same term, there must be a "
                              "bug, server exits")
                          .fmt(req.get_src()));
            ctx_->state_mgr_->system_exit(-1);
            ::exit(-1);
        }
        else
        {
            restart_election_timer();
        }
    }

    // After a snapshot the req.get_last_log_idx() may less than log_store_->next_slot() but equals to
    // log_store_->next_slot() -1 In this case, log is Okay if req.get_last_log_idx() == lastSnapshot.get_last_log_idx()
    // && req.get_last_log_term() == lastSnapshot.get_last_log_term() In not accepted case, we will return
    // log_store_->next_slot() for the leader to quick jump to the index that might aligned
    ptr<resp_msg> resp(cs_new<resp_msg>(
        state_->get_term(), msg_type::append_entries_response, id_, req.get_src(), log_store_->next_slot()));
    bool log_okay = req.get_last_log_idx() == 0 || (req.get_last_log_idx() < log_store_->next_slot() &&
                                                    req.get_last_log_term() == term_for_log(req.get_last_log_idx()));
    if (req.get_term() < state_->get_term() || !log_okay)
    {
        return resp;
    }

    // follower & log is okay
    if (req.log_entries().size() > 0)
    {
        // write logs to store, start from overlapped logs
        ulong idx = req.get_last_log_idx() + 1;
        size_t log_idx = 0;
        while (idx < log_store_->next_slot() && log_idx < req.log_entries().size())
        {
            if (log_store_->term_at(idx) == req.log_entries().at(log_idx)->get_term())
            {
                idx++;
                log_idx++;
            }
            else
            {
                break;
            }
        }

        // dealing with overwrites
        while (idx < log_store_->next_slot() && log_idx < req.log_entries().size())
        {
            ptr<log_entry> old_entry(log_store_->entry_at(idx));
            if (old_entry->get_val_type() == log_val_type::app_log)
            {
                state_machine_->rollback(idx, old_entry->get_buf(), old_entry->get_cookie());
            }
            else if (old_entry->get_val_type() == log_val_type::conf)
            {
                l_->info(sstrfmt("revert from a prev config change to config at %llu").fmt(config_->get_log_idx()));
                config_changing_ = false;
            }

            ptr<log_entry> entry = req.log_entries().at(log_idx);
            log_store_->write_at(idx, entry);
            if (entry->get_val_type() == log_val_type::app_log)
            {
                state_machine_->pre_commit(idx, entry->get_buf(), entry->get_cookie());
            }
            else if (entry->get_val_type() == log_val_type::conf)
            {
                l_->info(sstrfmt("receive a config change from leader at %llu").fmt(idx));
                config_changing_ = true;
            }

            idx += 1;
            log_idx += 1;
        }

        // append new log entries
        while (log_idx < req.log_entries().size())
        {
            ptr<log_entry> entry = req.log_entries().at(log_idx++);
            ulong idx_for_entry = log_store_->append(entry);
            if (entry->get_val_type() == log_val_type::conf)
            {
                l_->info(sstrfmt("receive a config change from leader at %llu").fmt(idx_for_entry));
                config_changing_ = true;
            }
            else if (entry->get_val_type() == log_val_type::app_log)
            {
                state_machine_->pre_commit(idx_for_entry, entry->get_buf(), entry->get_cookie());
            }
        }
    }

    leader_ = req.get_src();
    commit(req.get_commit_idx());
    resp->accept(req.get_last_log_idx() + req.log_entries().size() + 1);
    return resp;
}